

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharClassifier.cpp
# Opt level: O1

CharTypes Js::CharClassifier::GetBigCharTypeES6(codepoint_t ch,CharClassifier *instance)

{
  code *pcVar1;
  bool bVar2;
  UnicodeGeneralCategoryClass UVar3;
  CharTypes CVar4;
  undefined4 *puVar5;
  
  if (ch < 0x80) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/CharClassifier.cpp"
                                ,0xfd,"(ch > 0x7F)","ch > 0x7F");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar5 = 0;
  }
  CVar4 = _C_WSP;
  if (ch != 0xfeff) {
    UVar3 = PlatformAgnostic::UnicodeText::GetGeneralCategoryClass(ch);
    CVar4 = _C_UNK;
    if (UVar3 < CategoryClassOther) {
      CVar4 = *(CharTypes *)(&DAT_011b3c6c + (ulong)UVar3 * 4);
    }
  }
  return CVar4;
}

Assistant:

CharTypes Js::CharClassifier::GetBigCharTypeES6(codepoint_t ch, const Js::CharClassifier *instance)
{
    using namespace PlatformAgnostic::UnicodeText;

    Assert(ch > 0x7F);
    if (ch == 0xFEFF)
    {
        return CharTypes::_C_WSP;
    }

    UnicodeGeneralCategoryClass categoryClass = PlatformAgnostic::UnicodeText::GetGeneralCategoryClass(ch);

    switch(categoryClass)
    {
        case UnicodeGeneralCategoryClass::CategoryClassLetter:
            return CharTypes::_C_LET;
        case UnicodeGeneralCategoryClass::CategoryClassDigit:
            return CharTypes::_C_DIG;
        case UnicodeGeneralCategoryClass::CategoryClassLineSeparator:
        case UnicodeGeneralCategoryClass::CategoryClassParagraphSeparator:
            return CharTypes::_C_NWL;
        case UnicodeGeneralCategoryClass::CategoryClassSpaceSeparator:
        case UnicodeGeneralCategoryClass::CategoryClassSpacingCombiningMark:
        case UnicodeGeneralCategoryClass::CategoryClassNonSpacingMark:
        case UnicodeGeneralCategoryClass::CategoryClassConnectorPunctuation:
            return CharTypes::_C_WSP;
        default:
            break;
    }

    return CharTypes::_C_UNK;
}